

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SysInfo.cpp
# Opt level: O0

BOOL __thiscall AutoSystemInfo::GetAvailableCommit(AutoSystemInfo *this,ULONG64 *pCommit)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ULONG64 *pCommit_local;
  AutoSystemInfo *this_local;
  
  if ((this->initialized & 1U) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/SysInfo.cpp"
                       ,0x1b8,"(initialized)","initialized");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = this->availableCommit != 0;
  if (bVar2) {
    *pCommit = this->availableCommit;
  }
  this_local._4_4_ = (uint)bVar2;
  return this_local._4_4_;
}

Assistant:

BOOL AutoSystemInfo::GetAvailableCommit(ULONG64 *pCommit)
{
    Assert(initialized);

    // Non-zero value indicates we've been here before.
    if (this->availableCommit == 0)
    {
        return false;
    }

    *pCommit = this->availableCommit;
    return true;
}